

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

int Abc_NtkReplaceAutonomousLogic(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  long *plVar6;
  int iVar7;
  uint uVar8;
  uint *__ptr;
  void *pvVar9;
  Vec_Ptr_t *pVVar10;
  Abc_Obj_t *pObj;
  char *pName;
  size_t sVar11;
  int Fill;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *puVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  size_t __nmemb;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar9 = malloc(800);
  *(void **)(__ptr + 2) = pvVar9;
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    puVar12 = extraout_RDX;
    do {
      plVar3 = (long *)pVVar10->pArray[lVar15];
      if (plVar3 != (long *)0x0) {
        lVar14 = *plVar3;
        iVar7 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar14 + 0xe0),iVar7 + 1,(int)puVar12);
        if (((long)iVar7 < 0) || (*(int *)(lVar14 + 0xe4) <= iVar7)) {
LAB_00316fca:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        puVar12 = extraout_RDX_00;
        if ((*(int *)(*(long *)(lVar14 + 0xe8) + (long)iVar7 * 4) == *(int *)(*plVar3 + 0xd8)) &&
           (0 < *(int *)((long)plVar3 + 0x1c))) {
          lVar14 = 0;
          do {
            pAVar4 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                      (long)*(int *)(plVar3[4] + lVar14 * 4) * 8);
            pAVar5 = pAVar4->pNtk;
            iVar7 = pAVar4->Id;
            Vec_IntFillExtra(&pAVar5->vTravIds,iVar7 + 1,(int)puVar12);
            if (((long)iVar7 < 0) || ((pAVar5->vTravIds).nSize <= iVar7)) goto LAB_00316fca;
            puVar12 = extraout_RDX_01;
            if ((pAVar5->vTravIds).pArray[iVar7] != pAVar4->pNtk->nTravIds) {
              iVar7 = Abc_NtkCheckConstant_rec(pAVar4);
              if ((iVar7 == -1) &&
                 (((*(uint *)&pAVar4->field_0x14 & 0xf) != 5 ||
                  (plVar6 = (long *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray],
                  iVar7 = Abc_NtkCheckConstant_rec
                                    (*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                      (long)*(int *)plVar6[4] * 8)), iVar7 == -1)))) {
                if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
                  __assert_fail("!Abc_ObjIsLatch(pFanin)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                                ,0x377,"int Abc_NtkReplaceAutonomousLogic(Abc_Ntk_t *)");
                }
                uVar8 = __ptr[1];
                uVar1 = *__ptr;
                if (uVar8 == uVar1) {
                  if ((int)uVar1 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar9 = malloc(0x80);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    uVar13 = 0x10;
                  }
                  else {
                    uVar13 = uVar1 * 2;
                    if ((int)uVar13 <= (int)uVar1) goto LAB_00316e4b;
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar9 = malloc((ulong)uVar1 << 4);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 4);
                    }
                  }
                  *(void **)(__ptr + 2) = pvVar9;
                  *__ptr = uVar13;
                }
LAB_00316e4b:
                __ptr[1] = uVar8 + 1;
                *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar8 * 8) = pAVar4;
                puVar12 = __ptr;
              }
              else {
                Abc_NtkSetTravId_rec(pAVar4);
                puVar12 = extraout_RDX_02;
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < *(int *)((long)plVar3 + 0x1c));
        }
      }
      lVar15 = lVar15 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar15 < pVVar10->nSize);
  }
  __nmemb = (size_t)(int)__ptr[1];
  if (1 < (long)__nmemb) {
    pvVar9 = *(void **)(__ptr + 2);
    qsort(pvVar9,__nmemb,8,Abc_ObjPointerCompare);
    uVar8 = 1;
    sVar11 = 1;
    do {
      lVar15 = *(long *)((long)pvVar9 + sVar11 * 8);
      if (lVar15 != *(long *)((long)pvVar9 + sVar11 * 8 + -8)) {
        lVar14 = (long)(int)uVar8;
        uVar8 = uVar8 + 1;
        *(long *)((long)pvVar9 + lVar14 * 8) = lVar15;
      }
      sVar11 = sVar11 + 1;
    } while (__nmemb != sVar11);
    __ptr[1] = uVar8;
  }
  uVar8 = __ptr[1];
  if (0 < (long)(int)uVar8) {
    lVar15 = *(long *)(__ptr + 2);
    lVar14 = 0;
    do {
      pAVar4 = *(Abc_Obj_t **)(lVar15 + lVar14 * 8);
      pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      pName = Abc_ObjName(pObj);
      Abc_ObjAssignName(pObj,pName,(char *)0x0);
      pAVar5 = pObj->pNtk;
      iVar7 = pAVar5->nTravIds;
      iVar2 = pObj->Id;
      Vec_IntFillExtra(&pAVar5->vTravIds,iVar2 + 1,Fill);
      if (((long)iVar2 < 0) || ((pAVar5->vTravIds).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar5->vTravIds).pArray[iVar2] = iVar7;
      Abc_ObjTransferFanout(pAVar4,pObj);
      lVar14 = lVar14 + 1;
    } while ((int)uVar8 != lVar14);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return uVar8;
}

Assistant:

int Abc_NtkReplaceAutonomousLogic( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, k, Counter;
    // collect the nodes that feed into the reachable logic
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        // skip non-visited fanins
        if ( !Abc_NodeIsTravIdCurrent(pNode) )
            continue;
        // look for non-visited fanins
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            // skip visited fanins
            if ( Abc_NodeIsTravIdCurrent(pFanin) )
                continue;
            // skip constants and latches fed by constants
            if ( Abc_NtkCheckConstant_rec(pFanin) != -1 ||
                 (Abc_ObjIsBo(pFanin) && Abc_NtkCheckConstant_rec(Abc_ObjFanin0(Abc_ObjFanin0(pFanin))) != -1) )
            {
                Abc_NtkSetTravId_rec( pFanin );
                continue;
            }
            assert( !Abc_ObjIsLatch(pFanin) );
            Vec_PtrPush( vNodes, pFanin );
        }
    }
    Vec_PtrUniqify( vNodes, (int (*)(void))Abc_ObjPointerCompare );
    // replace these nodes by the PIs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pFanin = Abc_NtkCreatePi(pNtk);
        Abc_ObjAssignName( pFanin, Abc_ObjName(pFanin), NULL );
        Abc_NodeSetTravIdCurrent( pFanin );
        Abc_ObjTransferFanout( pNode, pFanin );
    }
    Counter = Vec_PtrSize(vNodes);
    Vec_PtrFree( vNodes );
    return Counter;
}